

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# satelite.cpp
# Opt level: O3

void __thiscall Clasp::SatElite::attach(SatElite *this,uint32 clauseId,bool initialClause)

{
  uint32 *puVar1;
  left_right_rep<Clasp::Literal,_unsigned_int> *this_00;
  undefined1 *puVar2;
  Clause *pCVar3;
  OccurList *pOVar4;
  uint uVar5;
  size_t __size;
  uint uVar6;
  undefined4 in_register_00000034;
  void *__ptr;
  void *pvVar7;
  uint v;
  uint local_44;
  indexed_priority_queue<Clasp::SatElite::LessOccCost> *local_40;
  ulong local_38;
  
  __ptr = (void *)CONCAT44(in_register_00000034,clauseId);
  local_38 = (ulong)clauseId;
  pCVar3 = (this->super_SatPreprocessor).clauses_.ebo_.buf[local_38];
  (pCVar3->data_).abstr = 0;
  if ((*(uint *)&pCVar3->field_0x8 & 0x3fffffff) != 0) {
    local_40 = &this->elimHeap_;
    uVar6 = 0;
    do {
      uVar5 = pCVar3->lits_[uVar6].rep_;
      v = uVar5 >> 2;
      pvVar7 = (void *)(ulong)v;
      __ptr = (void *)(ulong)clauseId;
      OccurList::add(this->occurs_ + (long)pvVar7,clauseId,SUB41((uVar5 & 2) >> 1,0));
      puVar2 = &this->occurs_[(long)pvVar7].field_0x18;
      *(ulong *)puVar2 = *(ulong *)puVar2 & 0x3fffffffffffffff;
      (pCVar3->data_).abstr =
           (pCVar3->data_).abstr | 1L << (((byte)pCVar3->lits_[uVar6].rep_ >> 2) - 1 & 0x3f);
      if ((v < (this->elimHeap_).indices_.ebo_.size) &&
         (__ptr = (void *)(local_40->indices_).ebo_.buf[(long)pvVar7],
         __ptr != (void *)0xffffffffffffffff)) {
        bk_lib::indexed_priority_queue<Clasp::SatElite::LessOccCost>::siftdown
                  (local_40,(key_type)__ptr);
      }
      else if (initialClause) {
        updateHeap(this,v);
        __ptr = pvVar7;
      }
      uVar6 = uVar6 + 1;
    } while (uVar6 != (*(uint *)&pCVar3->field_0x8 & 0x3fffffff));
  }
  pOVar4 = this->occurs_;
  uVar5 = pCVar3->lits_[0].rep_ >> 2;
  this_00 = (left_right_rep<Clasp::Literal,_unsigned_int> *)(pOVar4 + uVar5);
  uVar6 = pOVar4[uVar5].refs.super_type.super_left_right_rep<Clasp::Literal,_unsigned_int>.right_;
  __size = (ulong)pOVar4[uVar5].refs.super_type.super_left_right_rep<Clasp::Literal,_unsigned_int>.
                  left_ + 4;
  if (uVar6 < __size) {
    bk_lib::detail::left_right_rep<Clasp::Literal,_unsigned_int>::realloc(this_00,__ptr,__size);
    uVar6 = this_00->right_;
  }
  this_00->right_ = uVar6 - 4;
  *(uint32 *)(this_00->buf_ + (uVar6 - 4)) = clauseId;
  if (((this->super_SatPreprocessor).clauses_.ebo_.buf[local_38]->field_0xb & 0x40) == 0) {
    local_44 = clauseId;
    bk_lib::pod_vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
              (&this->queue_,&local_44);
    puVar2 = &(this->super_SatPreprocessor).clauses_.ebo_.buf[local_44]->field_0x8;
    *(uint *)puVar2 = *(uint *)puVar2 | 0x40000000;
  }
  puVar1 = &(this->super_SatPreprocessor).stats.clAdded;
  *puVar1 = *puVar1 + (uint)!initialClause;
  return;
}

Assistant:

void SatElite::attach(uint32 clauseId, bool initialClause) {
	Clause& c = *clause(clauseId);
	c.abstraction() = 0;
	for (uint32 i = 0; i != c.size(); ++i) {
		Var v = c[i].var();
		occurs_[v].add(clauseId, c[i].sign());
		occurs_[v].unmark();
		c.abstraction() |= Clause::abstractLit(c[i]);
		if (elimHeap_.is_in_queue(v)) {
			elimHeap_.decrease(v);
		}
		else if (initialClause) {
			updateHeap(v);
		}
	}
	occurs_[c[0].var()].addWatch(clauseId);
	addToSubQueue(clauseId);
	stats.clAdded += !initialClause;
}